

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

void __thiscall HEkk::unscaleSimplex(HEkk *this,HighsLp *incumbent_lp)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  const_reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  int *in_RSI;
  long in_RDI;
  HighsInt iVar_2;
  double factor_2;
  HighsInt iRow_1;
  double factor_1;
  HighsInt iVar_1;
  HighsInt iRow;
  double factor;
  HighsInt iVar;
  HighsInt iCol;
  vector<double,_std::allocator<double>_> *row_scale;
  vector<double,_std::allocator<double>_> *col_scale;
  HighsInt num_row;
  HighsInt num_col;
  double local_58;
  int local_4c;
  int local_3c;
  int local_2c;
  
  if ((*(byte *)(in_RDI + 0x2a50) & 1) != 0) {
    iVar2 = *in_RSI;
    iVar3 = in_RSI[1];
    for (local_2c = 0; local_2c < iVar2; local_2c = local_2c + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x88),(long)local_2c)
      ;
      dVar1 = *pvVar5;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2560),
                          (long)local_2c);
      *pvVar6 = *pvVar6 / dVar1;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2578),
                          (long)local_2c);
      *pvVar6 = *pvVar6 / dVar1;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2590),
                          (long)local_2c);
      *pvVar6 = *pvVar6 / dVar1;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25a8),
                          (long)local_2c);
      *pvVar6 = dVar1 * *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25c0),
                          (long)local_2c);
      *pvVar6 = dVar1 * *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25d8),
                          (long)local_2c);
      *pvVar6 = dVar1 * *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25f0),
                          (long)local_2c);
      *pvVar6 = dVar1 * *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2608),
                          (long)local_2c);
      *pvVar6 = dVar1 * *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2620),
                          (long)local_2c);
      *pvVar6 = dVar1 * *pvVar6;
    }
    for (local_3c = 0; local_3c < iVar3; local_3c = local_3c + 1) {
      iVar4 = iVar2 + local_3c;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x8e),(long)local_3c)
      ;
      dVar1 = *pvVar5;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2560),(long)iVar4);
      *pvVar6 = dVar1 * *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2578),(long)iVar4);
      *pvVar6 = dVar1 * *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2590),(long)iVar4);
      *pvVar6 = dVar1 * *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25a8),(long)iVar4);
      *pvVar6 = *pvVar6 / dVar1;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25c0),(long)iVar4);
      *pvVar6 = *pvVar6 / dVar1;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25d8),(long)iVar4);
      *pvVar6 = *pvVar6 / dVar1;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25f0),(long)iVar4);
      *pvVar6 = *pvVar6 / dVar1;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2608),(long)iVar4);
      *pvVar6 = *pvVar6 / dVar1;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2620),(long)iVar4);
      *pvVar6 = *pvVar6 / dVar1;
    }
    for (local_4c = 0; local_4c < iVar3; local_4c = local_4c + 1) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2978),(long)local_4c);
      iVar4 = *pvVar7;
      if (iVar4 < iVar2) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x88),(long)iVar4);
        local_58 = *pvVar5;
      }
      else {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x8e),
                            (long)(iVar4 - iVar2));
        local_58 = 1.0 / *pvVar5;
      }
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2638),
                          (long)local_4c);
      *pvVar6 = local_58 * *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2650),
                          (long)local_4c);
      *pvVar6 = local_58 * *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2668),
                          (long)local_4c);
      *pvVar6 = local_58 * *pvVar6;
    }
    *(undefined1 *)(in_RDI + 0x2a50) = 0;
  }
  return;
}

Assistant:

void HEkk::unscaleSimplex(const HighsLp& incumbent_lp) {
  if (!this->simplex_in_scaled_space_) return;
  assert(incumbent_lp.scale_.has_scaling);
  const HighsInt num_col = incumbent_lp.num_col_;
  const HighsInt num_row = incumbent_lp.num_row_;
  const vector<double>& col_scale = incumbent_lp.scale_.col;
  const vector<double>& row_scale = incumbent_lp.scale_.row;
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    const HighsInt iVar = iCol;
    const double factor = col_scale[iCol];
    this->info_.workCost_[iVar] /= factor;
    this->info_.workDual_[iVar] /= factor;
    this->info_.workShift_[iVar] /= factor;
    this->info_.workLower_[iVar] *= factor;
    this->info_.workUpper_[iVar] *= factor;
    this->info_.workRange_[iVar] *= factor;
    this->info_.workValue_[iVar] *= factor;
    this->info_.workLowerShift_[iVar] *= factor;
    this->info_.workUpperShift_[iVar] *= factor;
  }
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    const HighsInt iVar = num_col + iRow;
    const double factor = row_scale[iRow];
    this->info_.workCost_[iVar] *= factor;
    this->info_.workDual_[iVar] *= factor;
    this->info_.workShift_[iVar] *= factor;
    this->info_.workLower_[iVar] /= factor;
    this->info_.workUpper_[iVar] /= factor;
    this->info_.workRange_[iVar] /= factor;
    this->info_.workValue_[iVar] /= factor;
    this->info_.workLowerShift_[iVar] /= factor;
    this->info_.workUpperShift_[iVar] /= factor;
  }
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    double factor;
    const HighsInt iVar = this->basis_.basicIndex_[iRow];
    if (iVar < num_col) {
      factor = col_scale[iVar];
    } else {
      factor = 1.0 / row_scale[iVar - num_col];
    }
    this->info_.baseLower_[iRow] *= factor;
    this->info_.baseUpper_[iRow] *= factor;
    this->info_.baseValue_[iRow] *= factor;
  }
  this->simplex_in_scaled_space_ = false;
}